

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFtest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  uint *puVar1;
  pointer pnVar2;
  SPxOut *pSVar3;
  ostream *poVar4;
  char cVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  long_long_type lVar9;
  cpp_dec_float<100U,_int,_void> *pcVar10;
  fpclass_type fVar11;
  cpp_dec_float<100U,_int,_void> *v;
  char *pcVar12;
  pointer pnVar13;
  cpp_dec_float<100U,_int,_void> *this_00;
  long lVar14;
  long lVar15;
  cpp_dec_float<100U,_int,_void> vv;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  theeps;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  cpp_dec_float<100U,_int,_void> local_198;
  long local_148;
  Verbosity local_13c;
  cpp_dec_float<100U,_int,_void> *local_138;
  DIdxSet *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  entertol(&local_128,this);
  this->m_pricingViolUpToDate = true;
  this->m_pricingViolCoUpToDate = true;
  local_138 = &(this->m_pricingViol).m_backend;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_138,0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->m_pricingViolCo).m_backend,0);
  this->m_numViol = 0;
  (this->infeasibilities).super_IdxSet.num = 0;
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 0x10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems[6] = 0;
  local_d8.data._M_elems[7] = 0;
  local_d8.data._M_elems[8] = 0;
  local_d8.data._M_elems[9] = 0;
  local_d8.data._M_elems[10] = 0;
  local_d8.data._M_elems[0xb] = 0;
  local_d8.data._M_elems[0xc] = 0;
  local_d8.data._M_elems[0xd] = 0;
  local_d8.data._M_elems._56_5_ = 0;
  local_d8.data._M_elems[0xf]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_198,(long)(this->thecovectors->set).thenum,(type *)0x0);
  if (&local_d8 != &(this->sparsePricingFactor).m_backend) {
    local_d8.data._M_elems._0_8_ =
         *(undefined8 *)(this->sparsePricingFactor).m_backend.data._M_elems;
    local_d8.data._M_elems._8_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 2);
    local_d8.data._M_elems._16_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 4);
    local_d8.data._M_elems._24_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 6);
    local_d8.data._M_elems._32_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 8);
    local_d8.data._M_elems._40_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 10);
    local_d8.data._M_elems._48_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 0xc);
    uVar6 = *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 0xe);
    local_d8.data._M_elems._56_5_ = SUB85(uVar6,0);
    local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_d8.exp = (this->sparsePricingFactor).m_backend.exp;
    local_d8.neg = (this->sparsePricingFactor).m_backend.neg;
    local_d8.fpclass = (this->sparsePricingFactor).m_backend.fpclass;
    local_d8.prec_elem = (this->sparsePricingFactor).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_d8,&local_198);
  lVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_signed_long_long
                    (&local_d8);
  local_148 = -0x80000000;
  if (-0x80000000 < lVar9) {
    local_148 = lVar9;
  }
  if (0x7ffffffe < local_148) {
    local_148 = 0x7fffffff;
  }
  if (0 < (this->thecovectors->set).thenum) {
    local_130 = &this->infeasibilities;
    lVar15 = 0;
    lVar14 = 0;
    this_00 = local_138;
    do {
      pnVar13 = (this->theFvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((*(int *)((long)(&(pnVar13->m_backend).data + 1) + lVar15 + 8U) == 2) ||
         (pnVar2 = (this->theUBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         *(int *)((long)(&(pnVar2->m_backend).data + 1) + lVar15 + 8U) == 2)) {
LAB_003c7884:
        pcVar10 = (cpp_dec_float<100U,_int,_void> *)
                  ((long)(pnVar13->m_backend).data._M_elems + lVar15);
        v = (cpp_dec_float<100U,_int,_void> *)
            ((long)(((this->theLBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar15);
        local_198.fpclass = cpp_dec_float_finite;
        local_198.prec_elem = 0x10;
        local_198.data._M_elems[0] = 0;
        local_198.data._M_elems[1] = 0;
        local_198.data._M_elems[2] = 0;
        local_198.data._M_elems[3] = 0;
        local_198.data._M_elems[4] = 0;
        local_198.data._M_elems[5] = 0;
        local_198.data._M_elems[6] = 0;
        local_198.data._M_elems[7] = 0;
        local_198.data._M_elems[8] = 0;
        local_198.data._M_elems[9] = 0;
        local_198.data._M_elems[10] = 0;
        local_198.data._M_elems[0xb] = 0;
        local_198.data._M_elems[0xc] = 0;
        local_198.data._M_elems[0xd] = 0;
        local_198.data._M_elems._56_5_ = 0;
        local_198.data._M_elems[0xf]._1_3_ = 0;
        local_198.exp = 0;
        local_198.neg = false;
        if (v != &local_198) {
          if (pcVar10 != &local_198) {
            local_198.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
            local_198.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
            local_198.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
            local_198.data._M_elems._24_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 6);
            local_198.data._M_elems._32_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 8);
            local_198.data._M_elems._40_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 10);
            local_198.data._M_elems._48_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 0xc);
            uVar6 = *(undefined8 *)((pcVar10->data)._M_elems + 0xe);
            local_198.data._M_elems._56_5_ = SUB85(uVar6,0);
            local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
            local_198.exp = *(int *)((long)(&(pnVar13->m_backend).data + 1) + lVar15);
            local_198.neg = *(bool *)((long)(&(pnVar13->m_backend).data + 1) + lVar15 + 4U);
            local_198._72_8_ = *(undefined8 *)((long)(&(pnVar13->m_backend).data + 1) + lVar15 + 8U)
            ;
          }
          goto LAB_003c78fe;
        }
LAB_003c7908:
        local_198.fpclass = cpp_dec_float_finite;
        local_198.prec_elem = 0x10;
        local_198.neg = false;
        local_198.exp = 0;
        local_198.data._M_elems[0xf]._1_3_ = 0;
        local_198.data._M_elems._56_5_ = 0;
        local_198.data._M_elems[0xc] = 0;
        local_198.data._M_elems[0xd] = 0;
        local_198.data._M_elems[10] = 0;
        local_198.data._M_elems[0xb] = 0;
        local_198.data._M_elems[8] = 0;
        local_198.data._M_elems[9] = 0;
        local_198.data._M_elems[6] = 0;
        local_198.data._M_elems[7] = 0;
        local_198.data._M_elems[4] = 0;
        local_198.data._M_elems[5] = 0;
        local_198.data._M_elems[2] = 0;
        local_198.data._M_elems[3] = 0;
        local_198.data._M_elems[0] = 0;
        local_198.data._M_elems[1] = 0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_198,pcVar10);
        if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
          local_198.neg = (bool)(local_198.neg ^ 1);
        }
      }
      else {
        iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          ((cpp_dec_float<100U,_int,_void> *)
                           ((long)(pnVar13->m_backend).data._M_elems + lVar15),
                           (cpp_dec_float<100U,_int,_void> *)
                           ((long)(pnVar2->m_backend).data._M_elems + lVar15));
        if (iVar8 < 1) {
          pnVar13 = (this->theFvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_003c7884;
        }
        pnVar13 = (this->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar10 = (cpp_dec_float<100U,_int,_void> *)
                  ((long)(pnVar13->m_backend).data._M_elems + lVar15);
        v = (cpp_dec_float<100U,_int,_void> *)
            ((long)(((this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar15);
        local_198.fpclass = cpp_dec_float_finite;
        local_198.prec_elem = 0x10;
        local_198.data._M_elems[0] = 0;
        local_198.data._M_elems[1] = 0;
        local_198.data._M_elems[2] = 0;
        local_198.data._M_elems[3] = 0;
        local_198.data._M_elems[4] = 0;
        local_198.data._M_elems[5] = 0;
        local_198.data._M_elems[6] = 0;
        local_198.data._M_elems[7] = 0;
        local_198.data._M_elems[8] = 0;
        local_198.data._M_elems[9] = 0;
        local_198.data._M_elems[10] = 0;
        local_198.data._M_elems[0xb] = 0;
        local_198.data._M_elems[0xc] = 0;
        local_198.data._M_elems[0xd] = 0;
        local_198.data._M_elems._56_5_ = 0;
        local_198.data._M_elems[0xf]._1_3_ = 0;
        local_198.exp = 0;
        local_198.neg = false;
        if (v == &local_198) goto LAB_003c7908;
        if (pcVar10 != &local_198) {
          local_198.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
          local_198.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
          local_198.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
          local_198.data._M_elems._24_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 6);
          local_198.data._M_elems._32_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 8);
          local_198.data._M_elems._40_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 10);
          local_198.data._M_elems._48_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 0xc);
          uVar6 = *(undefined8 *)((pcVar10->data)._M_elems + 0xe);
          local_198.data._M_elems._56_5_ = SUB85(uVar6,0);
          local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_198.exp = *(int *)((long)(&(pnVar13->m_backend).data + 1) + lVar15);
          local_198.neg = *(bool *)((long)(&(pnVar13->m_backend).data + 1) + lVar15 + 4U);
          local_198._72_8_ = *(undefined8 *)((long)(&(pnVar13->m_backend).data + 1) + lVar15 + 8U);
        }
LAB_003c78fe:
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_198,v);
      }
      pnVar13 = (this->theCoTest).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)(pnVar13->m_backend).data._M_elems + lVar15 + 0x30);
      *(undefined8 *)puVar1 = local_198.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
      puVar1 = (uint *)((long)(pnVar13->m_backend).data._M_elems + lVar15 + 0x20);
      *(undefined8 *)puVar1 = local_198.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._40_8_;
      puVar1 = (uint *)((long)(pnVar13->m_backend).data._M_elems + lVar15 + 0x10);
      *(undefined8 *)puVar1 = local_198.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._24_8_;
      puVar1 = (uint *)((long)(pnVar13->m_backend).data._M_elems + lVar15);
      *(undefined8 *)puVar1 = local_198.data._M_elems._0_8_;
      *(undefined8 *)(puVar1 + 2) = local_198.data._M_elems._8_8_;
      *(int *)((long)(&(pnVar13->m_backend).data + 1) + lVar15) = local_198.exp;
      *(bool *)((long)(&(pnVar13->m_backend).data + 1) + lVar15 + 4U) = local_198.neg;
      *(undefined8 *)((long)(&(pnVar13->m_backend).data + 1) + lVar15 + 8U) = local_198._72_8_;
      pnVar13 = (this->theCoTest).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar10 = (cpp_dec_float<100U,_int,_void> *)
                ((long)(pnVar13->m_backend).data._M_elems + lVar15);
      local_198.data._M_elems[0xf]._1_3_ = local_128.m_backend.data._M_elems[0xf]._1_3_;
      local_198.data._M_elems._56_5_ = local_128.m_backend.data._M_elems._56_5_;
      local_198.data._M_elems[0] = local_128.m_backend.data._M_elems[0];
      uVar7 = local_198.data._M_elems[0];
      fVar11 = local_128.m_backend.fpclass;
      if (this->remainingRoundsLeave == 0) {
        local_198.data._M_elems[0] = local_128.m_backend.data._M_elems[0];
        local_198.data._M_elems[1] = local_128.m_backend.data._M_elems[1];
        local_198.data._M_elems[2] = local_128.m_backend.data._M_elems[2];
        local_198.data._M_elems[3] = local_128.m_backend.data._M_elems[3];
        local_198.data._M_elems[0xc] = local_128.m_backend.data._M_elems[0xc];
        local_198.data._M_elems[0xd] = local_128.m_backend.data._M_elems[0xd];
        local_198.data._M_elems[8] = local_128.m_backend.data._M_elems[8];
        local_198.data._M_elems[9] = local_128.m_backend.data._M_elems[9];
        local_198.data._M_elems[10] = local_128.m_backend.data._M_elems[10];
        local_198.data._M_elems[0xb] = local_128.m_backend.data._M_elems[0xb];
        local_198.data._M_elems[4] = local_128.m_backend.data._M_elems[4];
        local_198.data._M_elems[5] = local_128.m_backend.data._M_elems[5];
        local_198.data._M_elems[6] = local_128.m_backend.data._M_elems[6];
        local_198.data._M_elems[7] = local_128.m_backend.data._M_elems[7];
        local_198.exp = local_128.m_backend.exp;
        local_198.neg = local_128.m_backend.neg;
        local_198.fpclass = local_128.m_backend.fpclass;
        local_198.prec_elem = local_128.m_backend.prec_elem;
        if (uVar7 != 0 || fVar11 != cpp_dec_float_finite) {
          local_198.neg = (bool)(local_128.m_backend.neg ^ 1);
        }
        if (((fVar11 == cpp_dec_float_NaN) ||
            (*(int *)((long)(&(pnVar13->m_backend).data + 1) + lVar15 + 8U) == 2)) ||
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (pcVar10,&local_198), -1 < iVar8)) {
          (this->isInfeasible).data[lVar14] = 0;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (this_00,(cpp_dec_float<100U,_int,_void> *)
                             ((long)(((this->theCoTest).val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                    _M_elems + lVar15));
          DIdxSet::addIdx(local_130,(int)lVar14);
          (this->isInfeasible).data[lVar14] = 1;
          this->m_numViol = this->m_numViol + 1;
        }
        if ((int)local_148 < (this->infeasibilities).super_IdxSet.num) {
          pSVar3 = this->spxout;
          if ((pSVar3 != (SPxOut *)0x0) && (3 < (int)pSVar3->m_verbosity)) {
            local_198.data._M_elems[0] = pSVar3->m_verbosity;
            local_d8.data._M_elems[0] = 4;
            (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_d8);
            pSVar3 = this->spxout;
            std::__ostream_insert<char,std::char_traits<char>>
                      (pSVar3->m_streams[pSVar3->m_verbosity]," --- using dense pricing",0x18);
            cVar5 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
            std::ios::widen((char)*(undefined8 *)
                                   (*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) + cVar5
                           );
            this_00 = local_138;
            std::ostream::put(cVar5);
            std::ostream::flush();
            (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_198);
          }
          this->remainingRoundsLeave = 5;
          this->sparsePricingLeave = false;
          (this->infeasibilities).super_IdxSet.num = 0;
        }
      }
      else {
        local_198.data._M_elems[0] = local_128.m_backend.data._M_elems[0];
        local_198.data._M_elems[1] = local_128.m_backend.data._M_elems[1];
        local_198.data._M_elems[2] = local_128.m_backend.data._M_elems[2];
        local_198.data._M_elems[3] = local_128.m_backend.data._M_elems[3];
        local_198.data._M_elems[0xc] = local_128.m_backend.data._M_elems[0xc];
        local_198.data._M_elems[0xd] = local_128.m_backend.data._M_elems[0xd];
        local_198.data._M_elems[8] = local_128.m_backend.data._M_elems[8];
        local_198.data._M_elems[9] = local_128.m_backend.data._M_elems[9];
        local_198.data._M_elems[10] = local_128.m_backend.data._M_elems[10];
        local_198.data._M_elems[0xb] = local_128.m_backend.data._M_elems[0xb];
        local_198.data._M_elems[4] = local_128.m_backend.data._M_elems[4];
        local_198.data._M_elems[5] = local_128.m_backend.data._M_elems[5];
        local_198.data._M_elems[6] = local_128.m_backend.data._M_elems[6];
        local_198.data._M_elems[7] = local_128.m_backend.data._M_elems[7];
        local_198.exp = local_128.m_backend.exp;
        local_198.neg = local_128.m_backend.neg;
        local_198.fpclass = local_128.m_backend.fpclass;
        local_198.prec_elem = local_128.m_backend.prec_elem;
        if (uVar7 != 0 || fVar11 != cpp_dec_float_finite) {
          local_198.neg = (bool)(local_128.m_backend.neg ^ 1);
        }
        if (((fVar11 != cpp_dec_float_NaN) &&
            (*(int *)((long)(&(pnVar13->m_backend).data + 1) + lVar15 + 8U) != 2)) &&
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (pcVar10,&local_198), iVar8 < 0)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (this_00,(cpp_dec_float<100U,_int,_void> *)
                             ((long)(((this->theCoTest).val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                    _M_elems + lVar15));
          this->m_numViol = this->m_numViol + 1;
        }
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0x50;
    } while (lVar14 < (this->thecovectors->set).thenum);
  }
  iVar8 = (this->infeasibilities).super_IdxSet.num;
  if ((iVar8 == 0) && (this->sparsePricingLeave == false)) {
    this->remainingRoundsLeave = this->remainingRoundsLeave + -1;
  }
  else if ((iVar8 <= (int)local_148) && (this->sparsePricingLeave == false)) {
    pSVar3 = this->spxout;
    if ((pSVar3 != (SPxOut *)0x0) && (local_13c = pSVar3->m_verbosity, 3 < (int)local_13c)) {
      local_198.data._M_elems[0] = 4;
      (*pSVar3->_vptr_SPxOut[2])();
      poVar4 = this->spxout->m_streams[this->spxout->m_verbosity];
      local_148 = *(long *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8);
      if (this->hyperPricingLeave == true) {
        pcVar12 = " --- using hypersparse pricing, ";
        lVar14 = 0x20;
      }
      else {
        pcVar12 = " --- using sparse pricing, ";
        lVar14 = 0x1b;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar12,lVar14);
      pSVar3 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity],"sparsity: ",10);
      poVar4 = pSVar3->m_streams[pSVar3->m_verbosity];
      lVar14 = *(long *)poVar4;
      *(undefined8 *)(poVar4 + *(long *)(lVar14 + -0x18) + 0x10) = 6;
      *(uint *)(poVar4 + *(long *)(lVar14 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(lVar14 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar4 + *(long *)(lVar14 + -0x18) + 8) = 4;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_d8,(long)this->m_numViol,(type *)0x0);
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_198,(long)(this->thecovectors->set).thenum,(type *)0x0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_88,&local_d8,&local_198);
      boost::multiprecision::operator<<
                (pSVar3->m_streams[pSVar3->m_verbosity],
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_88);
      poVar4 = pSVar3->m_streams[pSVar3->m_verbosity];
      lVar14 = *(long *)poVar4;
      *(uint *)(poVar4 + *(long *)(lVar14 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(lVar14 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar4 + *(long *)(lVar14 + -0x18) + 8) = (long)(int)local_148;
      std::ios::widen((char)*(undefined8 *)(lVar14 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_13c);
    }
    this->sparsePricingLeave = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFtest()
{

   assert(type() == LEAVE);

   R theeps = entertol();
   m_pricingViolUpToDate = true;
   m_pricingViolCoUpToDate = true;
   m_pricingViol = 0;
   m_pricingViolCo = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());

   for(int i = 0; i < dim(); ++i)
   {
      theCoTest[i] = ((*theFvec)[i] > theUBbound[i])
                     ? theUBbound[i] - (*theFvec)[i]
                     : (*theFvec)[i] - theLBbound[i];

      if(remainingRoundsLeave == 0)
      {
         if(theCoTest[i] < -theeps)
         {
            m_pricingViol -= theCoTest[i];
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
            ++m_numViol;
         }
         else
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

         if(infeasibilities.size() > sparsitythreshold)
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                          << std::endl;)
            remainingRoundsLeave = SOPLEX_DENSEROUNDS;
            sparsePricingLeave = false;
            infeasibilities.clear();
         }
      }
      else if(theCoTest[i] < -theeps)
      {
         m_pricingViol -= theCoTest[i];
         m_numViol++;
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingLeave)
   {
      --remainingRoundsLeave;
   }
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingLeave)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingLeave)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) m_numViol / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingLeave = true;
   }
}